

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void duckdb::ModeFunction<duckdb::ModeStandard<int>>::
     Window<duckdb::ModeState<int,duckdb::ModeStandard<int>>,int,int>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  _func_int **pp_Var1;
  long lVar2;
  ulong uVar3;
  pointer pFVar4;
  DataChunk *pDVar5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ModeState<int,_duckdb::ModeStandard<int>_> *pMVar7;
  ModeIncluded<duckdb::ModeState<int,_duckdb::ModeStandard<int>_>_> *pMVar8;
  _Hashtable<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  ColumnDataScanState *pCVar12;
  const_iterator cVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  ColumnDataScanState *row;
  FrameBounds *frame;
  pointer pFVar16;
  byte bVar17;
  Updater updater;
  ModeIncluded<duckdb::ModeState<int,_duckdb::ModeStandard<int>_>_> included;
  UpdateWindowState<duckdb::ModeState<int,_duckdb::ModeStandard<int>_>,_int> local_58;
  undefined1 local_48 [16];
  unsigned_long local_38;
  
  ModeState<int,_duckdb::ModeStandard<int>_>::InitializePage
            ((ModeState<int,_duckdb::ModeStandard<int>_> *)l_state,partition);
  pp_Var1 = *(_func_int ***)(partition + 0x58);
  lVar2 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  if (*(long *)l_state == *(long *)(l_state + 8)) {
    std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,1);
  }
  this_00 = *(_Hashtable<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              **)(l_state + 0x18);
  local_48._0_8_ = pp_Var1;
  local_48._8_8_ = l_state;
  if (this_00 ==
      (_Hashtable<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) {
    duckdb::Allocator::DefaultAllocator();
    this_00 = (_Hashtable<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)operator_new(0x38);
    *(undefined8 *)&this_00->_M_rehash_policy = 0;
    (this_00->_M_rehash_policy)._M_next_resize = 0;
    this_00->_M_buckets = &this_00->_M_single_bucket;
    this_00->_M_bucket_count = 1;
    (this_00->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
    this_00->_M_element_count = 0;
    (this_00->_M_rehash_policy)._M_max_load_factor = 1.0;
    (this_00->_M_rehash_policy)._M_next_resize = 0;
    this_00->_M_single_bucket = (__node_base_ptr)0x0;
    *(_Hashtable<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      **)(l_state + 0x18) = this_00;
  }
  if (this_00->_M_element_count >> 2 < *(ulong *)(l_state + 0x28)) {
    pvVar9 = vector<duckdb::FrameBounds,_true>::back((vector<duckdb::FrameBounds,_true> *)l_state);
    uVar3 = pvVar9->end;
    pvVar10 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar10->start < uVar3) {
      pvVar10 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar3 = pvVar10->end;
      pvVar9 = vector<duckdb::FrameBounds,_true>::front
                         ((vector<duckdb::FrameBounds,_true> *)l_state);
      if (pvVar9->start < uVar3) {
        local_58.included =
             (ModeIncluded<duckdb::ModeState<int,_duckdb::ModeStandard<int>_>_> *)local_48;
        local_58.state = (ModeState<int,_duckdb::ModeStandard<int>_> *)l_state;
        AggregateExecutor::
        IntersectFrames<duckdb::ModeFunction<duckdb::ModeStandard<int>>::UpdateWindowState<duckdb::ModeState<int,duckdb::ModeStandard<int>>,int>>
                  ((SubFrames *)l_state,frames,&local_58);
        goto LAB_00558727;
      }
    }
    this_00 = *(_Hashtable<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                **)(l_state + 0x18);
    if (this_00 !=
        (_Hashtable<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         *)0x0) goto LAB_00558627;
  }
  else {
LAB_00558627:
    std::
    _Hashtable<int,_std::pair<const_int,_duckdb::ModeAttr>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(this_00);
  }
  l_state[0x28] = '\0';
  l_state[0x29] = '\0';
  l_state[0x2a] = '\0';
  l_state[0x2b] = '\0';
  l_state[0x2c] = '\0';
  l_state[0x2d] = '\0';
  l_state[0x2e] = '\0';
  l_state[0x2f] = '\0';
  l_state[0x38] = '\0';
  l_state[0x39] = '\0';
  l_state[0x3a] = '\0';
  l_state[0x3b] = '\0';
  l_state[0x3c] = '\0';
  l_state[0x3d] = '\0';
  l_state[0x3e] = '\0';
  l_state[0x3f] = '\0';
  l_state[0x30] = '\0';
  pFVar16 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_start;
  pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar16 != pFVar4) {
    do {
      for (row = (ColumnDataScanState *)pFVar16->start; row < (ColumnDataScanState *)pFVar16->end;
          row = (ColumnDataScanState *)
                ((long)&(row->current_chunk_state).handles._M_h._M_buckets + 1)) {
        if ((*pp_Var1 == (_func_int *)0x0) ||
           ((*(ulong *)(*pp_Var1 + ((ulong)row >> 6) * 8) >> ((ulong)row & 0x3f) & 1) != 0)) {
          pDVar5 = *(DataChunk **)(l_state + 0x48);
          if ((row < *(ColumnDataScanState **)(pDVar5 + 0x58)) &&
             (pCVar12 = *(ColumnDataScanState **)(pDVar5 + 0x50), pCVar12 <= row)) {
            pvVar11 = *(reference *)(l_state + 0x98);
          }
          else {
            duckdb::ColumnDataCollection::Seek(*(ulong *)(l_state + 0x40),row,pDVar5);
            pvVar11 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)(l_state + 0x50),0);
            *(undefined8 *)(l_state + 0x90) = *(undefined8 *)(pvVar11 + 0x20);
            pvVar11 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)(l_state + 0x50),0);
            FlatVector::VerifyFlatVector(pvVar11);
            pvVar11 = pvVar11 + 0x28;
            *(reference *)(l_state + 0x98) = pvVar11;
            pCVar12 = *(ColumnDataScanState **)(*(long *)(l_state + 0x48) + 0x50);
          }
          if ((*(long *)pvVar11 == 0) ||
             ((*(ulong *)(*(long *)pvVar11 +
                         ((ulong)((long)row - (long)pCVar12) >> 6 & 0x3ffffff) * 8) >>
               ((long)row - (long)pCVar12 & 0x3fU) & 1) != 0)) {
            ModeState<int,_duckdb::ModeStandard<int>_>::ModeAdd
                      ((ModeState<int,_duckdb::ModeStandard<int>_> *)l_state,(idx_t)row);
          }
        }
      }
      pFVar16 = pFVar16 + 1;
    } while (pFVar16 != pFVar4);
  }
LAB_00558727:
  bVar17 = l_state[0x30];
  if (bVar17 == 0) {
    cVar13 = ModeState<int,_duckdb::ModeStandard<int>_>::Scan
                       ((ModeState<int,_duckdb::ModeStandard<int>_> *)l_state);
    if (cVar13.super__Node_iterator_base<std::pair<const_int,_duckdb::ModeAttr>,_false>._M_cur ==
        (__node_type *)0x0) {
      bVar17 = l_state[0x30];
    }
    else {
      **(undefined4 **)(l_state + 0x20) =
           *(undefined4 *)
            ((long)cVar13.super__Node_iterator_base<std::pair<const_int,_duckdb::ModeAttr>,_false>.
                   _M_cur + 8);
      lVar6 = *(long *)((long)cVar13.
                              super__Node_iterator_base<std::pair<const_int,_duckdb::ModeAttr>,_false>
                              ._M_cur + 0x10);
      *(long *)(l_state + 0x38) = lVar6;
      bVar17 = lVar6 != 0;
      l_state[0x30] = bVar17;
    }
  }
  if ((bVar17 & 1) == 0) {
    _Var15._M_head_impl = *(unsigned_long **)(result + 0x28);
    if (_Var15._M_head_impl == (unsigned_long *)0x0) {
      local_38 = *(unsigned_long *)(result + 0x40);
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_58,&local_38);
      pMVar8 = local_58.included;
      pMVar7 = local_58.state;
      local_58.state = (ModeState<int,_duckdb::ModeStandard<int>_> *)0x0;
      local_58.included = (ModeIncluded<duckdb::ModeState<int,_duckdb::ModeStandard<int>_>_> *)0x0;
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
      *(ModeState<int,_duckdb::ModeStandard<int>_> **)(result + 0x30) = pMVar7;
      *(ModeIncluded<duckdb::ModeState<int,_duckdb::ModeStandard<int>_>_> **)(result + 0x38) =
           pMVar8;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.included !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.included);
        }
      }
      pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (result + 0x30));
      _Var15._M_head_impl =
           (pTVar14->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      *(unsigned_long **)(result + 0x28) = _Var15._M_head_impl;
    }
    bVar17 = (byte)rid & 0x3f;
    _Var15._M_head_impl[rid >> 6] =
         _Var15._M_head_impl[rid >> 6] & (-2L << bVar17 | 0xfffffffffffffffeU >> 0x40 - bVar17);
  }
  else {
    *(undefined4 *)(lVar2 + rid * 4) = **(undefined4 **)(l_state + 0x20);
  }
  std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
            ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,
             &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t rid) {
		auto &state = *reinterpret_cast<STATE *>(l_state);

		state.InitializePage(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);
		auto &prevs = state.prevs;
		if (prevs.empty()) {
			prevs.resize(1);
		}

		ModeIncluded<STATE> included(fmask, state);

		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(Allocator::DefaultAllocator());
		}
		const size_t tau_inverse = 4; // tau==0.25
		if (state.nonzero <= (state.frequency_map->size() / tau_inverse) || prevs.back().end <= frames.front().start ||
		    frames.back().end <= prevs.front().start) {
			state.Reset();
			// for f ∈ F do
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						state.ModeAdd(i);
					}
				}
			}
		} else {
			using Updater = UpdateWindowState<STATE, INPUT_TYPE>;
			Updater updater(state, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}

		if (!state.valid) {
			// Rescan
			auto highest_frequency = state.Scan();
			if (highest_frequency != state.frequency_map->end()) {
				*(state.mode) = highest_frequency->first;
				state.count = highest_frequency->second.count;
				state.valid = (state.count > 0);
			}
		}

		if (state.valid) {
			rdata[rid] = TYPE_OP::template Assign<INPUT_TYPE, RESULT_TYPE>(result, *state.mode);
		} else {
			rmask.Set(rid, false);
		}

		prevs = frames;
	}